

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall MPLSStreamInfo::parseStreamEntry(MPLSStreamInfo *this,BitStreamReader *reader)

{
  uchar uVar1;
  int iVar2;
  BitStreamReader *reader_local;
  MPLSStreamInfo *this_local;
  
  BitStreamReader::skipBits(reader,8);
  uVar1 = BitStreamReader::getBits<unsigned_char>(reader,8);
  this->type = uVar1;
  if (this->type == '\x01') {
    iVar2 = BitStreamReader::getBits<int>(reader,0x10);
    (this->super_M2TSStreamInfo).streamPID = iVar2;
    BitStreamReader::skipBits(reader,0x20);
    BitStreamReader::skipBits(reader,0x10);
  }
  else if (this->type == '\x02') {
    BitStreamReader::skipBits(reader,0x10);
    iVar2 = BitStreamReader::getBits<int>(reader,0x10);
    (this->super_M2TSStreamInfo).streamPID = iVar2;
    BitStreamReader::skipBits(reader,0x20);
  }
  else if ((this->type == '\x03') || (this->type == '\x04')) {
    BitStreamReader::skipBits(reader,8);
    iVar2 = BitStreamReader::getBits<int>(reader,0x10);
    (this->super_M2TSStreamInfo).streamPID = iVar2;
    BitStreamReader::skipBits(reader,0x20);
    BitStreamReader::skipBits(reader,8);
  }
  return;
}

Assistant:

void MPLSStreamInfo::parseStreamEntry(BitStreamReader& reader)
{
    reader.skipBits(8);  // length
    type = reader.getBits<uint8_t>(8);
    if (type == 1)
    {
        streamPID = reader.getBits<int>(16);
        reader.skipBits(32);
        reader.skipBits(16);
    }
    else if (type == 2)
    {
        reader.skipBits(16);  // ref_to_SubPath_id, ref_to_subClip_entry_id
        streamPID = reader.getBits<int>(16);
        reader.skipBits(32);
    }
    else if (type == 3 || type == 4)
    {
        reader.skipBits(8);  // ref_to_SubPath_id
        streamPID = reader.getBits<int>(16);
        reader.skipBits(32);
        reader.skipBits(8);
    }
}